

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_to_string_Test::TestBody
          (WelcomeMessageTest_test_to_string_Test *this)

{
  bool bVar1;
  char *message_00;
  AssertHelper local_78;
  Message local_70 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  WelcomeMessage message;
  WelcomeMessageTest_test_to_string_Test *this_local;
  
  bidfx_public_api::price::pixie::WelcomeMessage::WelcomeMessage
            ((WelcomeMessage *)&gtest_ar.message_,1,0xe807e361,0xde3c3f54);
  bidfx_public_api::price::pixie::WelcomeMessage::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[61],std::__cxx11::string>
            ((EqHelper<false> *)local_38,
             "\"Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)\"","message.ToString()"
             ,(char (*) [61])"Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)",
             &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x5d,message_00);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_to_string)
{
    WelcomeMessage message = WelcomeMessage(1, 3892831073, 3728490324);
    ASSERT_EQ("Welcome(version=1, clientID=0xe807e361, serverID=0xde3c3f54)", message.ToString());
}